

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O2

int stss_create_request(application_protocol *proto,request *req)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  long in_FS_OFFSET;
  double dVar4;
  
  puVar1 = (undefined8 *)proto->arg;
  plVar2 = *(long **)(in_FS_OFFSET + -0x178);
  if (plVar2 == (long *)0x0) {
    plVar2 = (long *)malloc(0x18);
    *(long **)(in_FS_OFFSET + -0x178) = plVar2;
    if (plVar2 == (long *)0x0) {
      __assert_fail("per_thread_arg",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                    ,0xaa,"int stss_create_request(struct application_protocol *, struct request *)"
                   );
    }
  }
  dVar4 = generate((rand_gen *)*puVar1);
  lVar3 = lround(dVar4);
  *plVar2 = lVar3;
  dVar4 = generate((rand_gen *)puVar1[1]);
  lVar3 = lround(dVar4);
  plVar2[1] = lVar3;
  dVar4 = generate((rand_gen *)puVar1[2]);
  lVar3 = lround(dVar4);
  plVar2[2] = lVar3;
  req->iovs[0].iov_base = *(void **)(in_FS_OFFSET + -0x178);
  req->iovs[0].iov_len = 0x18;
  req->iovs[1].iov_base = random_char;
  req->iovs[1].iov_len = plVar2[1];
  req->iov_cnt = 2;
  if (*(int *)(puVar1 + 3) == 0) {
    req->meta = (void *)0x0;
    return 0;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                ,0xbc,"int stss_create_request(struct application_protocol *, struct request *)");
}

Assistant:

int stss_create_request(struct application_protocol *proto,
		struct request *req)
{
	struct stss_data *data = (struct stss_data *)proto->arg;
	long *req_payload;

	if (!per_thread_arg) {
		per_thread_arg = malloc(3*sizeof(long));
		assert(per_thread_arg);
	}
	req_payload = (long *)per_thread_arg;
	req_payload[0] = lround(generate(data->time_gen));
	req_payload[1] = lround(generate(data->req_size_gen));
	req_payload[2] = lround(generate(data->rep_size_gen));
	req->iovs[0].iov_base = per_thread_arg;
	req->iovs[0].iov_len = 3*sizeof(long);
	req->iovs[1].iov_base = random_char;
	req->iovs[1].iov_len = req_payload[1];
	req->iov_cnt = 2;
	if (data->replicated) {
#ifdef ENABLE_R2P2
		if (drand48() <= data->read_ratio)
			req->meta = (void *)(unsigned long)REPLICATED_ROUTE_NO_SE;
		else
			req->meta = (void *)(unsigned long)REPLICATED_ROUTE;
#else
		assert(0);
#endif
	} else
		req->meta = NULL;

	return 0;
}